

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall
kratos::InlineGeneratorVisitor::RenameLinkedVar::visit(RenameLinkedVar *this,SwitchStmt *stmt)

{
  Var *this_00;
  element_type *var;
  Var *pVVar1;
  enable_shared_from_this<kratos::Var> local_50 [2];
  undefined1 local_30 [24];
  Var *v;
  SwitchStmt *stmt_local;
  RenameLinkedVar *this_local;
  
  v = (Var *)stmt;
  stmt_local = (SwitchStmt *)this;
  SwitchStmt::target((SwitchStmt *)local_30);
  var = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  pVVar1 = match(this,var);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_30);
  this_00 = v;
  if (pVVar1 != (Var *)0x0) {
    local_30._16_8_ = pVVar1;
    std::enable_shared_from_this<kratos::Var>::shared_from_this(local_50);
    SwitchStmt::set_target((SwitchStmt *)this_00,(shared_ptr<kratos::Var> *)local_50);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_50);
  }
  return;
}

Assistant:

void visit(SwitchStmt* stmt) override {
            if (auto* v = match(stmt->target().get())) {
                stmt->set_target(v->shared_from_this());
            }
        }